

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_friends_base(parser *p)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  undefined8 *p_00;
  char *pcVar5;
  monster_base *pmVar6;
  random_conflict rVar7;
  char *role_name;
  wchar_t wStack_34;
  random number;
  monster_friends_base *f;
  monster_race *r;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    p_00 = (undefined8 *)mem_zalloc(0x20);
    rVar7 = parser_getrand(p,"number");
    wStack_34 = rVar7.dice;
    *(wchar_t *)(p_00 + 3) = wStack_34;
    number.base = rVar7.sides;
    *(int *)((long)p_00 + 0x1c) = number.base;
    uVar2 = parser_getuint(p,"chance");
    *(uint *)((long)p_00 + 0x14) = uVar2;
    pcVar5 = parser_getsym(p,"name");
    pmVar6 = lookup_monster_base(pcVar5);
    p_00[1] = pmVar6;
    if (p_00[1] == 0) {
      mem_free(p_00);
      p_local._4_4_ = PARSE_ERROR_INVALID_MONSTER_BASE;
    }
    else {
      _Var1 = parser_hasval(p,"role");
      if (_Var1) {
        pcVar5 = parser_getsym(p,"role");
        iVar3 = strcmp(pcVar5,"servant");
        if (iVar3 == 0) {
          *(undefined4 *)(p_00 + 2) = 1;
        }
        else {
          iVar3 = strcmp(pcVar5,"bodyguard");
          if (iVar3 != 0) {
            mem_free(p_00);
            return PARSE_ERROR_INVALID_MONSTER_ROLE;
          }
          *(undefined4 *)(p_00 + 2) = 2;
        }
      }
      else {
        *(undefined4 *)(p_00 + 2) = 3;
      }
      *p_00 = *(undefined8 *)((long)pvVar4 + 0xb0);
      *(undefined8 **)((long)pvVar4 + 0xb0) = p_00;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_friends_base(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_friends_base *f;
	struct random number;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	f = mem_zalloc(sizeof *f);
	number = parser_getrand(p, "number");
	f->number_dice = number.dice;
	f->number_side = number.sides;
	f->percent_chance = parser_getuint(p, "chance");
	f->base = lookup_monster_base(parser_getsym(p, "name"));
	if (!f->base) {
		mem_free(f);
		return PARSE_ERROR_INVALID_MONSTER_BASE;
	}
	if (parser_hasval(p, "role")) {
		const char *role_name = parser_getsym(p, "role");
		if (streq(role_name, "servant")) {
			f->role = MON_GROUP_SERVANT;
		} else if (streq(role_name, "bodyguard")) {
			f->role = MON_GROUP_BODYGUARD;
		} else {
			mem_free(f);
			return PARSE_ERROR_INVALID_MONSTER_ROLE;
		}
	} else {
		f->role = MON_GROUP_MEMBER;
	}

	f->next = r->friends_base;
	r->friends_base = f;

	return PARSE_ERROR_NONE;
}